

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cia.c
# Opt level: O2

int cia_write_from_ncsd(CIAContext *context,NCSDContext *ncsd,
                       _func_void_uint32_t_uint64_t_uint64_t *on_progress)

{
  FILE *__stream;
  __off64_t __off;
  uchar *input;
  uint64_t uVar1;
  size_t sVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  mbedtls_sha256_context ctx;
  
  __stream = (FILE *)context->fd;
  iVar3 = -1;
  if ((__stream != (FILE *)0x0) && (context->writable != 0)) {
    write_struct_with_padding((FILE *)__stream,context,0x2020);
    write_struct_with_padding((FILE *)__stream,context->cert_chain,context->cert_chain_size);
    write_struct_with_padding((FILE *)__stream,&context->ticket,0x350);
    write_struct_with_padding((FILE *)__stream,&context->field_4,context->tmd_sig_size);
    __off = ftello64(__stream);
    write_struct_with_padding
              ((FILE *)__stream,&context->tmd_body,context->chunk_count * 0x30 + 0x9c4);
    input = (uchar *)malloc(0x800000);
    fwrite(&context->ncch,0x200,1,__stream);
    fwrite(&context->exheader,0x800,1,__stream);
    mbedtls_sha256_init(&ctx);
    uVar5 = 0;
    mbedtls_sha256_starts(&ctx,0);
    mbedtls_sha256_update(&ctx,(context->ncch).signature,0x200);
    mbedtls_sha256_update(&ctx,(uchar *)&context->exheader,0x800);
    uVar1 = ncsd_read_part_start(ncsd,0,0xa00);
    uVar4 = uVar1;
    while( true ) {
      (*on_progress)(0,uVar5,uVar1);
      if (uVar4 == 0) break;
      sVar2 = 0x800000;
      if (uVar4 < 0x800000) {
        sVar2 = uVar4;
      }
      sVar2 = ncsd_read_part(ncsd,input,sVar2);
      mbedtls_sha256_update(&ctx,input,sVar2);
      fwrite(input,1,sVar2,__stream);
      uVar4 = uVar4 - sVar2;
      uVar5 = uVar1 - uVar4;
    }
    mbedtls_sha256_finish(&ctx,context->tmd_chunks[0].hash);
    mbedtls_sha256_free(&ctx);
    if ((ncsd->header).partition_geometry[1].size != 0) {
      mbedtls_sha256_init(&ctx);
      uVar5 = 0;
      mbedtls_sha256_starts(&ctx,0);
      uVar1 = ncsd_read_part_start(ncsd,1,0);
      uVar4 = uVar1;
      while( true ) {
        (*on_progress)(1,uVar5,uVar1);
        if (uVar4 == 0) break;
        sVar2 = 0x800000;
        if (uVar4 < 0x800000) {
          sVar2 = uVar4;
        }
        sVar2 = ncsd_read_part(ncsd,input,sVar2);
        mbedtls_sha256_update(&ctx,input,sVar2);
        fwrite(input,1,sVar2,__stream);
        uVar4 = uVar4 - sVar2;
        uVar5 = uVar1 - uVar4;
      }
      mbedtls_sha256_finish(&ctx,context->tmd_chunks[1].hash);
      mbedtls_sha256_free(&ctx);
    }
    if ((ncsd->header).partition_geometry[2].size != 0) {
      mbedtls_sha256_init(&ctx);
      uVar5 = 0;
      mbedtls_sha256_starts(&ctx,0);
      uVar1 = ncsd_read_part_start(ncsd,2,0);
      uVar4 = uVar1;
      while( true ) {
        (*on_progress)(2,uVar5,uVar1);
        if (uVar4 == 0) break;
        sVar2 = 0x800000;
        if (uVar4 < 0x800000) {
          sVar2 = uVar4;
        }
        sVar2 = ncsd_read_part(ncsd,input,sVar2);
        mbedtls_sha256_update(&ctx,input,sVar2);
        fwrite(input,1,sVar2,__stream);
        uVar4 = uVar4 - sVar2;
        uVar5 = uVar1 - uVar4;
      }
      mbedtls_sha256_finish(&ctx,context->tmd_chunks[2].hash);
      mbedtls_sha256_free(&ctx);
    }
    free(input);
    fwrite(&context->meta,0x400,1,__stream);
    fwrite(context->smdh_icon,1,context->smdh_icon_size,__stream);
    iVar3 = 0;
    mbedtls_sha256((uchar *)context->tmd_chunks,context->chunk_count * 0x30,
                   (context->tmd_body).content_info[0].hash,0);
    mbedtls_sha256((uchar *)(context->tmd_body).content_info,0x900,(context->tmd_body).hash,0);
    fseeko64(__stream,__off,0);
    write_struct_with_padding
              ((FILE *)__stream,&context->tmd_body,context->chunk_count * 0x30 + 0x9c4);
  }
  return iVar3;
}

Assistant:

int cia_write_from_ncsd(CIAContext *context, NCSDContext *ncsd, void (*on_progress)(uint32_t part, uint64_t prog, uint64_t total)) {
    const uint64_t read_size = 0x800000;
    mbedtls_sha256_context ctx;
    FILE *fd = (FILE*)context->fd;
    uint64_t save_off;
    uint64_t left, total_size;
    uint8_t* dataread;
    if (fd == NULL || !context->writable) return -1;
    write_struct_with_padding(fd, &context->header, sizeof(CIAHeader));
    write_struct_with_padding(fd, context->cert_chain, context->cert_chain_size);
    write_struct_with_padding(fd, &context->ticket, sizeof(ETicket));
    write_struct_with_padding(fd, &context->tmd_sig4096, context->tmd_sig_size);
    save_off = ftello(fd);
    write_struct_with_padding(fd, &context->tmd_body, sizeof(TMDBody) + sizeof(TMDContentChunk) * context->chunk_count);

    dataread = (uint8_t*)malloc(read_size);

    fwrite(&context->ncch, sizeof(NCCHHeader), 1, fd);
    fwrite(&context->exheader, sizeof(ExHeader), 1, fd);
    mbedtls_sha256_init(&ctx);
    mbedtls_sha256_starts(&ctx, 0);
    mbedtls_sha256_update(&ctx, (const uint8_t*)&context->ncch, sizeof(NCCHHeader));
    mbedtls_sha256_update(&ctx, (const uint8_t*)&context->exheader, sizeof(ExHeader));
    total_size = left = ncsd_read_part_start(ncsd, 0, sizeof(NCCHHeader) + sizeof(ExHeader));
    on_progress(0, 0, total_size);
    while (left > 0) {
        size_t to_read = (size_t)(read_size < left ? read_size : left);
        size_t readbytes = ncsd_read_part(ncsd, dataread, to_read);
        mbedtls_sha256_update(&ctx, dataread, readbytes);
        fwrite(dataread, 1, readbytes, fd);
        left -= readbytes;
        on_progress(0, total_size - left, total_size);
    }
    mbedtls_sha256_finish(&ctx, context->tmd_chunks[0].hash);
    mbedtls_sha256_free(&ctx);

    // Manual CFA
    if (ncsd->header.partition_geometry[1].size != 0) {
        mbedtls_sha256_init(&ctx);
        mbedtls_sha256_starts(&ctx, 0);
        total_size = left = ncsd_read_part_start(ncsd, 1, 0);
        on_progress(1, 0, total_size);
        while (left > 0) {
            size_t to_read = (size_t)(read_size < left ? read_size : left);
            size_t readbytes = ncsd_read_part(ncsd, dataread, to_read);
            mbedtls_sha256_update(&ctx, dataread, readbytes);
            fwrite(dataread, 1, readbytes, fd);
            left -= readbytes;
            on_progress(1, total_size - left, total_size);
        }
        mbedtls_sha256_finish(&ctx, context->tmd_chunks[1].hash);
        mbedtls_sha256_free(&ctx);
    }

    // Download Play child container CFA
    if (ncsd->header.partition_geometry[2].size != 0) {
        mbedtls_sha256_init(&ctx);
        mbedtls_sha256_starts(&ctx, 0);
        total_size = left = ncsd_read_part_start(ncsd, 2, 0);
        on_progress(2, 0, total_size);
        while (left > 0) {
            size_t to_read = (size_t)(read_size < left ? read_size : left);
            size_t readbytes = ncsd_read_part(ncsd, dataread, to_read);
            mbedtls_sha256_update(&ctx, dataread, readbytes);
            fwrite(dataread, 1, readbytes, fd);
            left -= readbytes;
            on_progress(2, total_size - left, total_size);
        }
        mbedtls_sha256_finish(&ctx, context->tmd_chunks[2].hash);
        mbedtls_sha256_free(&ctx);
    }
    free(dataread);
    
    fwrite(&context->meta, sizeof(CIAMeta), 1, fd);
    fwrite(context->smdh_icon, 1, context->smdh_icon_size, fd);

    // update final hashes
    mbedtls_sha256((const uint8_t*)&context->tmd_chunks[0], sizeof(TMDContentChunk) * context->chunk_count, context->tmd_body.content_info[0].hash, 0);
    mbedtls_sha256((const uint8_t*)&context->tmd_body.content_info[0], sizeof(TMDContentInfo) * 64, context->tmd_body.hash, 0);
    fseeko(fd, save_off, SEEK_SET);
    write_struct_with_padding(fd, &context->tmd_body, sizeof(TMDBody) + sizeof(TMDContentChunk) * context->chunk_count);
    return 0;
}